

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<float>_>::DecomposeColumn
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t col,int64_t prevcol)

{
  complex<float> **ppcVar1;
  complex<float> *__z;
  long lVar2;
  long lVar3;
  complex<float> *__z_00;
  undefined8 extraout_XMM0_Qa;
  _ComplexT extraout_XMM0_Qa_00;
  float fVar4;
  float fVar5;
  
  ppcVar1 = (this->fElem).fStore;
  __z = ppcVar1[prevcol];
  lVar3 = (prevcol - ((long)ppcVar1[prevcol + 1] - (long)__z >> 3)) + 1;
  lVar2 = (col - ((long)ppcVar1[col + 1] - (long)ppcVar1[col] >> 3)) + 1;
  if (lVar2 < lVar3) {
    lVar2 = lVar3;
  }
  if (prevcol < lVar2) {
    std::operator<<((ostream *)&std::cout,"error condition\n");
    std::ostream::flush();
    return;
  }
  fVar4 = 0.0;
  fVar5 = 0.0;
  __z_00 = ppcVar1[col] + (col - lVar2);
  for (lVar3 = prevcol * 8 + lVar2 * -8; lVar3 != 0; lVar3 = lVar3 + -8) {
    std::operator*((complex<float> *)((long)&__z->_M_value + lVar3),__z_00);
    fVar4 = fVar4 + (float)extraout_XMM0_Qa;
    fVar5 = fVar5 + (float)((ulong)extraout_XMM0_Qa >> 0x20);
    __z_00 = __z_00 + -1;
  }
  __z_00->_M_value =
       CONCAT44((float)(__z_00->_M_value >> 0x20) - fVar5,(float)__z_00->_M_value - fVar4);
  if (__z_00 != __z) {
    std::complex<float>::operator/=(__z_00,__z);
    return;
  }
  std::sqrt<float>(__z_00);
  __z_00->_M_value = extraout_XMM0_Qa_00;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        *run2=sqrt(*run2);
    }
    
}